

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int solvePlain(char *filename)

{
  int iVar1;
  HDual solver;
  int RtCd;
  HModel model;
  undefined4 in_stack_fffffffffffea330;
  HModel aHStack_15cc8 [88];
  HDual *in_stack_fffffffffffea390;
  HModel local_11a0 [4508];
  int local_4;
  
  HModel::HModel(local_11a0);
  iVar1 = HModel::load_fromMPS((char *)local_11a0);
  local_4 = iVar1;
  if (iVar1 == 0) {
    HModel::scaleModel();
    HDual::HDual(in_stack_fffffffffffea390);
    HDual::solve(aHStack_15cc8,(int)local_11a0,0);
    HModel::util_reportSolverOutcome((char *)local_11a0);
    HModel::util_reportModelDense();
    local_4 = 0;
    HDual::~HDual(in_stack_fffffffffffea390);
  }
  HModel::~HModel((HModel *)CONCAT44(iVar1,in_stack_fffffffffffea330));
  return local_4;
}

Assistant:

int solvePlain(const char *filename) {
  HModel model;
  //  model.intOption[INTOPT_PRINT_FLAG] = 1;
    int RtCd = model.load_fromMPS(filename);
  //  int RtCd = model.load_fromToy(filename);
  if (RtCd) return RtCd;
  
  model.scaleModel();
  HDual solver;
  solver.solve(&model);
  model.util_reportSolverOutcome("Solve plain");
#ifdef JAJH_dev
  model.util_reportModelDense();
  //Possibly analyse the degeneracy of the primal and dual activities
  //  model.util_anPrDuDgn();
#endif
  //  model.util_reportModel();
  //model.util_reportModelSolution();
  return 0;
}